

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_compareBaseUnitsAgainstItself_Test::TestBody(Units_compareBaseUnitsAgainstItself_Test *this)

{
  char *pcVar1;
  double local_48;
  double local_40;
  AssertionResult gtest_ar;
  UnitsPtr u1;
  
  libcellml::Units::create();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"frufru",(allocator<char> *)&local_48);
  libcellml::NamedEntity::setName
            ((string *)u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&gtest_ar);
  local_48 = 1.0;
  local_40 = (double)libcellml::Units::scalingFactor((shared_ptr *)&u1,(shared_ptr *)&u1,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"1.0","libcellml::Units::scalingFactor(u1, u1)",&local_48,
             &local_40);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x424,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, compareBaseUnitsAgainstItself)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("frufru");

    EXPECT_EQ(1.0, libcellml::Units::scalingFactor(u1, u1));
}